

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox_safe.cpp
# Opt level: O2

ssize_t __thiscall
zmq::mailbox_safe_t::send(mailbox_safe_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  pointer ppsVar1;
  bool bVar2;
  ssize_t extraout_RAX;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  ulong uVar3;
  pointer ppsVar4;
  
  uVar3 = (ulong)(uint)__fd;
  mutex_t::lock(this->_sync);
  ypipe_t<zmq::command_t,_16>::write(&this->_cpipe,__fd,(void *)0x0,__n);
  bVar2 = ypipe_t<zmq::command_t,_16>::flush(&this->_cpipe);
  if (!bVar2) {
    std::_V2::condition_variable_any::notify_all(&(this->_cond_var)._cv);
    ppsVar1 = (this->_signalers).
              super__Vector_base<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    __buf_00 = extraout_RDX;
    for (ppsVar4 = (this->_signalers).
                   super__Vector_base<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>._M_impl
                   .super__Vector_impl_data._M_start; ppsVar4 != ppsVar1; ppsVar4 = ppsVar4 + 1) {
      signaler_t::send(*ppsVar4,(int)uVar3,__buf_00,__n,__flags);
      __buf_00 = extraout_RDX_00;
    }
  }
  mutex_t::unlock(this->_sync);
  return extraout_RAX;
}

Assistant:

void zmq::mailbox_safe_t::send (const command_t &cmd_)
{
    _sync->lock ();
    _cpipe.write (cmd_, false);
    const bool ok = _cpipe.flush ();

    if (!ok) {
        _cond_var.broadcast ();

        for (std::vector<signaler_t *>::iterator it = _signalers.begin (),
                                                 end = _signalers.end ();
             it != end; ++it) {
            (*it)->send ();
        }
    }

    _sync->unlock ();
}